

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O1

void __thiscall ot::commissioner::security_material::SMRoot::Set(SMRoot *this,string *aRoot)

{
  size_type sVar1;
  
  std::__cxx11::string::_M_assign((string *)this);
  sVar1 = (this->mRootPath)._M_string_length;
  if ((sVar1 != 0) && ((this->mRootPath)._M_dataplus._M_p[sVar1 - 1] != '/')) {
    std::__cxx11::string::append((char *)this);
    return;
  }
  return;
}

Assistant:

void Set(const std::string aRoot)
    {
        mRootPath = aRoot;
        if (mRootPath.length() > 0 && mRootPath.back() != '/')
        {
            mRootPath += "/";
        }
    }